

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O3

void __thiscall
google::protobuf::MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,void>::
MergeFrom<google::protobuf::RepeatedFieldRef<proto2_unittest::ForeignMessage,void>>
          (MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,void> *this,
          RepeatedFieldRef<proto2_unittest::ForeignMessage,_void> *container)

{
  void *pvVar1;
  AccessorType *pAVar2;
  bool bVar3;
  __uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
  _Var4;
  undefined8 uVar5;
  Iterator it;
  RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> local_70;
  RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> local_50;
  
  pvVar1 = container->data_;
  pAVar2 = container->accessor_;
  _Var4.
  super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>.
  _M_t.
  super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
  .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl =
       (__uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>)
       Arena::DefaultConstruct<proto2_unittest::ForeignMessage>((Arena *)0x0);
  local_70.data_ = pvVar1;
  local_70.accessor_ = pAVar2;
  local_70.iterator_ = (void *)(**(code **)(*(long *)pAVar2 + 0x48))(pAVar2,pvVar1);
  local_70.scratch_space_._M_t.
  super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>.
  _M_t.
  super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
  .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
          )_Var4.
           super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
           .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl;
  while( true ) {
    local_50.data_ = container->data_;
    local_50.accessor_ = container->accessor_;
    local_50.iterator_ = (void *)(**(code **)(*(long *)local_50.accessor_ + 0x50))();
    local_50.scratch_space_._M_t.
    super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
    .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
          )(__uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
            )0x0;
    bVar3 = protobuf::internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::
            operator!=(&local_70,&local_50);
    protobuf::internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::
    ~RepeatedFieldRefIterator(&local_50);
    if (!bVar3) break;
    uVar5 = (**(code **)(*(long *)local_70.accessor_ + 0x78))
                      (local_70.accessor_,local_70.data_,local_70.iterator_,
                       local_70.scratch_space_._M_t.
                       super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
                       .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl);
    (**(code **)(**(long **)(this + 8) + 0x28))(*(long **)(this + 8),*(undefined8 *)this,uVar5);
    local_70.iterator_ =
         (void *)(**(code **)(*(long *)local_70.accessor_ + 0x60))
                           (local_70.accessor_,local_70.data_,local_70.iterator_);
  }
  protobuf::internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::
  ~RepeatedFieldRefIterator(&local_70);
  return;
}

Assistant:

void MergeFrom(const Container& container) const {
    typedef typename Container::const_iterator Iterator;
    for (Iterator it = container.begin(); it != container.end(); ++it) {
      Add(*it);
    }
  }